

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall
duckdb::RowGroupCollection::NextParallelScan
          (RowGroupCollection *this,ClientContext *context,ParallelCollectionScanState *state,
          CollectionScanState *scan_state)

{
  mutex *__mutex;
  RowGroupCollection *collection;
  RowGroup *row_group;
  __int_type _Var1;
  bool bVar2;
  int iVar3;
  ClientConfig *pCVar4;
  RowGroupSegmentTree *pRVar5;
  RowGroup *pRVar6;
  idx_t iVar7;
  ulong uVar8;
  lock_guard<std::mutex> l;
  idx_t iVar9;
  ulong uVar10;
  
  __mutex = &state->lock;
  do {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
LAB_0061441e:
      ::std::__throw_system_error(iVar3);
    }
    if ((state->current_row_group == (RowGroup *)0x0) ||
       ((state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
        super___atomic_base<unsigned_long>._M_i == 0)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar3 == 0) {
        scan_state->batch_index = state->batch_index;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return false;
      }
      goto LAB_0061441e;
    }
    collection = state->collection;
    row_group = state->current_row_group;
    pCVar4 = ClientConfig::GetConfig(context);
    if (pCVar4->verify_parallelism == true) {
      iVar9 = state->vector_index;
      uVar10 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
               super___atomic_base<unsigned_long>._M_i;
      uVar8 = state->vector_index * 0x800 + 0x800;
      if (uVar10 < uVar8) {
        uVar8 = uVar10;
      }
      uVar8 = uVar8 + (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).start;
      iVar7 = state->vector_index + 1;
      state->vector_index = iVar7;
      if ((state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
          super___atomic_base<unsigned_long>._M_i <= iVar7 * 0x800) {
        pRVar5 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
        pRVar6 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                           (&pRVar5->super_SegmentTree<duckdb::RowGroup,_true>,
                            state->current_row_group);
        state->current_row_group = pRVar6;
        state->vector_index = 0;
      }
    }
    else {
      LOCK();
      (state->processed_rows).super___atomic_base<unsigned_long>._M_i =
           (state->processed_rows).super___atomic_base<unsigned_long>._M_i +
           (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
           super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      iVar9 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).start;
      _Var1 = (state->current_row_group->super_SegmentBase<duckdb::RowGroup>).count.
              super___atomic_base<unsigned_long>._M_i;
      pRVar5 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
      pRVar6 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                         (&pRVar5->super_SegmentTree<duckdb::RowGroup,_true>,
                          state->current_row_group);
      uVar8 = _Var1 + iVar9;
      state->current_row_group = pRVar6;
      iVar9 = 0;
    }
    uVar10 = state->max_row;
    if (uVar8 < state->max_row) {
      uVar10 = uVar8;
    }
    iVar7 = state->batch_index + 1;
    state->batch_index = iVar7;
    scan_state->batch_index = iVar7;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    bVar2 = InitializeScanInRowGroup(scan_state,collection,row_group,iVar9,uVar10);
    if (bVar2) {
      return true;
    }
  } while( true );
}

Assistant:

bool RowGroupCollection::NextParallelScan(ClientContext &context, ParallelCollectionScanState &state,
                                          CollectionScanState &scan_state) {
	while (true) {
		idx_t vector_index;
		idx_t max_row;
		RowGroupCollection *collection;
		RowGroup *row_group;
		{
			// select the next row group to scan from the parallel state
			lock_guard<mutex> l(state.lock);
			if (!state.current_row_group || state.current_row_group->count == 0) {
				// no more data left to scan
				break;
			}
			collection = state.collection;
			row_group = state.current_row_group;
			if (ClientConfig::GetConfig(context).verify_parallelism) {
				vector_index = state.vector_index;
				max_row = state.current_row_group->start +
				          MinValue<idx_t>(state.current_row_group->count,
				                          STANDARD_VECTOR_SIZE * state.vector_index + STANDARD_VECTOR_SIZE);
				D_ASSERT(vector_index * STANDARD_VECTOR_SIZE < state.current_row_group->count);
				state.vector_index++;
				if (state.vector_index * STANDARD_VECTOR_SIZE >= state.current_row_group->count) {
					state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
					state.vector_index = 0;
				}
			} else {
				state.processed_rows += state.current_row_group->count;
				vector_index = 0;
				max_row = state.current_row_group->start + state.current_row_group->count;
				state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
			}
			max_row = MinValue<idx_t>(max_row, state.max_row);
			scan_state.batch_index = ++state.batch_index;
		}
		D_ASSERT(collection);
		D_ASSERT(row_group);

		// initialize the scan for this row group
		bool need_to_scan = InitializeScanInRowGroup(scan_state, *collection, *row_group, vector_index, max_row);
		if (!need_to_scan) {
			// skip this row group
			continue;
		}
		return true;
	}
	lock_guard<mutex> l(state.lock);
	scan_state.batch_index = state.batch_index;
	return false;
}